

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void TPZFMatrix<long_double>::MultAdd
               (longdouble *ptr,int64_t rows,int64_t cols,TPZFMatrix<long_double> *x,
               TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,longdouble alpha,
               longdouble beta,int opt)

{
  ulong uVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<long_double> *pTVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  TPZFMatrix<long_double> *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  longdouble *in_RDI;
  TPZFMatrix<long_double> *in_R8;
  TPZFMatrix<long_double> *in_R9;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  int in_stack_00000028;
  char *in_stack_00000058;
  char *in_stack_00000060;
  longdouble *xlast;
  longdouble *xp_1;
  longdouble val;
  longdouble *zp_2;
  longdouble *fp_1;
  longdouble *xp;
  longdouble *fp;
  longdouble *zlast_1;
  longdouble *zp_1;
  int64_t c_1;
  int64_t i;
  longdouble *yp;
  longdouble *zlast;
  longdouble *zp;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  uint numeq;
  ulong local_158;
  TPZFMatrix<long_double> *in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffec0;
  longdouble *local_f0;
  longdouble local_e8;
  longdouble *local_d0;
  longdouble *local_c8;
  longdouble *local_b8;
  longdouble *local_a8;
  long local_a0;
  long local_98;
  longdouble *local_80;
  long local_78;
  long local_70;
  
  if (((in_stack_00000028 == 0) &&
      (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX), in_RDX != uVar1)) ||
     ((in_stack_00000028 != 0 &&
      (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX), in_RSI != uVar1)))) {
    Error(in_stack_00000060,in_stack_00000058);
    return;
  }
  if ((in_stack_00000018 != (longdouble)0) || (NAN(in_stack_00000018) || NAN((longdouble)0))) {
    if (((in_stack_00000028 != 0) ||
        (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_R8), in_RSI == uVar1)) &&
       ((in_stack_00000028 == 0 ||
        (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_R8), in_RDX == uVar1)))) {
      iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_R8);
      iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
      if (iVar2 == iVar3) goto LAB_012277cc;
    }
    Error(in_stack_00000060,in_stack_00000058);
  }
  else {
LAB_012277cc:
    if (in_stack_00000028 == 0) {
      iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_R9);
      iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
      if ((iVar2 != iVar3) || (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_R9), uVar1 != in_RSI)
         ) {
        iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
        (*(in_R9->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0xe])(in_R9,in_RSI,iVar2);
      }
    }
    else {
      in_stack_fffffffffffffec0 =
           (TPZFMatrix<long_double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_R9);
      pTVar4 = (TPZFMatrix<long_double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
      if ((in_stack_fffffffffffffec0 != pTVar4) ||
         (uVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_R9), uVar1 != in_RDX)) {
        in_stack_fffffffffffffeb0 = in_R9;
        in_stack_fffffffffffffeb8 = in_RDX;
        iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
        (*(in_stack_fffffffffffffeb0->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0xe])
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,iVar2);
      }
    }
    local_158 = in_RSI;
    if (in_stack_00000028 != 0) {
      local_158 = in_RDX;
    }
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
    if (in_RSI * in_RDX != 0) {
      for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
        local_80 = operator()(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              (int64_t)in_stack_fffffffffffffeb0);
        plVar5 = local_80 + (local_158 & 0xffffffff);
        if ((in_stack_00000018 != (longdouble)0) || (NAN(in_stack_00000018) || NAN((longdouble)0)))
        {
          plVar5 = g(in_R8,0,local_70);
          if (in_R9 != in_R8) {
            memcpy(local_80,plVar5,(local_158 & 0xffffffff) << 4);
          }
          for (local_98 = 0; local_98 < (long)(local_158 & 0xffffffff); local_98 = local_98 + 1) {
            for (local_a0 = 0; local_a0 < iVar2; local_a0 = local_a0 + 1) {
              plVar5 = operator()(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                  (int64_t)in_stack_fffffffffffffeb0);
              *plVar5 = *plVar5 * in_stack_00000018;
            }
          }
        }
        else {
          for (; local_80 != plVar5; local_80 = local_80 + 1) {
            *local_80 = (longdouble)0;
          }
        }
      }
      for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
        if (in_stack_00000028 == 0) {
          for (local_78 = 0; local_78 < (long)in_RDX; local_78 = local_78 + 1) {
            local_a8 = operator()(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                  (int64_t)in_stack_fffffffffffffeb0);
            plVar5 = local_a8 + in_RSI;
            plVar6 = g(in_RCX,local_78,local_70);
            local_b8 = in_RDI + in_RSI * local_78;
            for (; local_a8 < plVar5; local_a8 = local_a8 + 1) {
              *local_a8 = *local_b8 * in_stack_00000008 * *plVar6 + *local_a8;
              local_b8 = local_b8 + 1;
            }
          }
        }
        else {
          local_d0 = operator()(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                (int64_t)in_stack_fffffffffffffeb0);
          local_c8 = in_RDI;
          for (local_78 = 0; local_78 < (long)in_RDX; local_78 = local_78 + 1) {
            local_e8 = (longdouble)0;
            local_f0 = g(in_RCX,0,local_70);
            plVar5 = local_f0 + in_RSI;
            for (; local_f0 < plVar5; local_f0 = local_f0 + 1) {
              local_e8 = *local_c8 * *local_f0 + local_e8;
              local_c8 = local_c8 + 1;
            }
            *local_d0 = in_stack_00000008 * local_e8 + *local_d0;
            local_d0 = local_d0 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}